

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage.c
# Opt level: O3

HCOSE_MAC COSE_Mac_Init(COSE_INIT_FLAGS flags,cose_errback *perr)

{
  _Bool _Var1;
  COSE_MacMessage *p;
  
  if (flags == COSE_INIT_FLAGS_NONE) {
    p = (COSE_MacMessage *)calloc(1,0x60);
    if (p == (COSE_MacMessage *)0x0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_OUT_OF_MEMORY;
      }
    }
    else {
      _Var1 = _COSE_Init(COSE_INIT_FLAGS_NONE,(COSE *)p,0x61,perr);
      if (_Var1) {
        _COSE_InsertInList(&MacRoot,(COSE *)p);
        return (HCOSE_MAC)p;
      }
      _COSE_Mac_Release(p);
      free(p);
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_PARAMETER;
  }
  return (HCOSE_MAC)0x0;
}

Assistant:

HCOSE_MAC COSE_Mac_Init(COSE_INIT_FLAGS flags, CBOR_CONTEXT_COMMA cose_errback * perr)
{
	COSE_MacMessage * pobj = NULL;

	CHECK_CONDITION(flags == COSE_INIT_FLAGS_NONE, COSE_ERR_INVALID_PARAMETER);

	pobj = (COSE_MacMessage *)COSE_CALLOC(1, sizeof(COSE_MacMessage), context);
	CHECK_CONDITION(pobj != NULL, COSE_ERR_OUT_OF_MEMORY);

	if (!_COSE_Init(flags, &pobj->m_message, COSE_mac_object, CBOR_CONTEXT_PARAM_COMMA perr)) {
		goto errorReturn;
	}

	_COSE_InsertInList(&MacRoot, &pobj->m_message);

	return (HCOSE_MAC)pobj;

errorReturn:
	if (pobj != NULL) {
		_COSE_Mac_Release(pobj);
		COSE_FREE(pobj, context);
	}
	return NULL;
}